

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
          (IfcReinforcingElement *this,void **vtt)

{
  void **vtt_local;
  IfcReinforcingElement *this_local;
  
  IfcBuildingElementComponent::IfcBuildingElementComponent
            (&this->super_IfcBuildingElementComponent,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcReinforcingElement,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcReinforcingElement,_1UL> *)
             &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158,
             vtt + 0x32);
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
              super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.
                                super_IfcElement.super_IfcProduct.super_IfcObject + -0x18)) =
       vtt[0x34];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x88 = vtt[0x35];
  (this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0xd0 = vtt[0x37];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.field_0x100 = vtt[0x38];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             field_0x138 = vtt[0x39];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             field_0x148 = vtt[0x3a];
  *(void **)&(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.field_0x158 =
       vtt[0x3b];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcBuildingElementComponent).field_0x168);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}